

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

void * list_append(list *list,void *data)

{
  list_item *plVar1;
  list *plVar2;
  
  plVar1 = (list_item *)malloc(0x10);
  if (plVar1 != (list_item *)0x0) {
    plVar1->next = (list_item *)0x0;
    plVar1->data = data;
    plVar2 = list;
    if (list->head != (list_item *)0x0) {
      plVar2 = (list *)list->tail;
    }
    plVar2->head = plVar1;
    list->tail = plVar1;
  }
  return plVar1;
}

Assistant:

void *list_append(struct list *list, void *data)
{
    struct list_item *item = malloc(sizeof(struct list_item));
    if (item == NULL) {
        return NULL;
    }
    item->next = NULL;
    item->data = data;
    if (list->head == NULL) {
        list->head = item;
    } else {
        list->tail->next = item;
    }
    list->tail = item;
    return item;
}